

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Template.hpp
# Opt level: O3

QOperation
Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::getOperation
          (char *content,SizeT *offset,SizeT end_offset)

{
  uint uVar1;
  char *pcVar2;
  int iVar3;
  byte bVar4;
  char cVar5;
  QOperation QVar6;
  SizeT SVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  
  uVar8 = *offset;
  if (end_offset <= uVar8) {
    return NoOp;
  }
LAB_00124570:
  uVar9 = (ulong)uVar8;
  bVar4 = content[uVar9];
  if (bVar4 < 0x3d) {
    switch(bVar4) {
    case 0x21:
      cVar5 = content[uVar9 + 1];
      QVar6 = NotEqual;
LAB_00124714:
      if (cVar5 != '=') {
        return Error;
      }
      return QVar6;
    case 0x22:
    case 0x23:
    case 0x24:
    case 0x27:
    case 0x29:
    case 0x2c:
    case 0x2e:
      break;
    case 0x25:
      return Remainder;
    case 0x26:
      return (content[uVar9 + 1] != '&') << 3 | And;
    case 0x28:
      uVar1 = uVar8 + 1;
      *offset = uVar1;
      if (end_offset <= uVar1) {
        return Error;
      }
      SVar7 = uVar8 + 2;
      uVar9 = (ulong)uVar1;
      iVar10 = 0;
      do {
        if (content[uVar9] == '(') {
          iVar10 = iVar10 + 1;
        }
        else if (content[uVar9] == ')') {
          if (iVar10 == 0) goto LAB_001246c3;
          iVar10 = iVar10 + -1;
        }
        iVar3 = (1 - end_offset) + SVar7;
        uVar9 = uVar9 + 1;
        *offset = SVar7;
        SVar7 = SVar7 + 1;
        if (iVar3 == 1) {
          return Error;
        }
      } while( true );
    case 0x2a:
      return Multiplication;
    case 0x2b:
      do {
        if (uVar9 == 0) goto switchD_00124593_caseD_22;
        cVar5 = content[uVar9 - 1];
        uVar9 = uVar9 - 1;
      } while (cVar5 == ' ');
      if (((cVar5 == ')') || (cVar5 == '}')) || ((byte)(cVar5 - 0x30U) < 10)) {
        return Addition;
      }
      break;
    case 0x2d:
      do {
        if (uVar9 == 0) goto switchD_00124593_caseD_22;
        cVar5 = content[uVar9 - 1];
        uVar9 = uVar9 - 1;
      } while (cVar5 == ' ');
      if (((cVar5 == ')') || (cVar5 == '}')) || ((byte)(cVar5 - 0x30U) < 10)) {
        return Subtraction;
      }
      break;
    case 0x2f:
      return Division;
    default:
      if (bVar4 == 0x3c) {
        return (content[uVar9 + 1] != '=') * '\x02' + LessOrEqual;
      }
    }
switchD_00124593_caseD_22:
    uVar8 = uVar8 + 1;
    *offset = uVar8;
  }
  else {
    if (bVar4 < 0x7b) {
      if (bVar4 == 0x3d) {
        cVar5 = content[uVar9 + 1];
        QVar6 = Equal;
        goto LAB_00124714;
      }
      if (bVar4 == 0x3e) {
        return (content[uVar9 + 1] != '=') * '\x02' | GreaterOrEqual;
      }
      if (bVar4 == 0x5e) {
        return Exponent;
      }
      goto switchD_00124593_caseD_22;
    }
    if (bVar4 != 0x7b) {
      if (bVar4 == 0x7c) {
        return (content[uVar9 + 1] != '|') * '\b' + Or;
      }
      goto switchD_00124593_caseD_22;
    }
    uVar9 = (ulong)(uVar8 + 1);
    do {
      *offset = (uint)uVar9;
      if (end_offset <= (uint)uVar9) {
        *offset = end_offset;
        return Error;
      }
      uVar8 = uVar8 + 1;
      pcVar2 = content + uVar9;
      uVar9 = uVar9 + 1;
    } while (*pcVar2 != '}');
  }
  goto LAB_001246b6;
LAB_001246c3:
  uVar8 = (uint)uVar9;
LAB_001246b6:
  if (end_offset <= uVar8) {
    return NoOp;
  }
  goto LAB_00124570;
}

Assistant:

static QOperation getOperation(const Char_T *content, SizeT &offset, const SizeT end_offset) noexcept {
        using QOperationSymbol = QOperationSymbol_T<Char_T>;

        while (offset < end_offset) {
            switch (content[offset]) {
                case QOperationSymbol::OrExp: { // ||
                    if (content[(offset + 1)] == QOperationSymbol::OrExp) {
                        return QOperation::Or;
                    }

                    return QOperation::BitwiseOr;
                }

                case QOperationSymbol::AndExp: { // &&
                    if (content[(offset + 1)] == QOperationSymbol::AndExp) {
                        return QOperation::And;
                    }

                    return QOperation::BitwiseAnd;
                }

                case QOperationSymbol::GreaterExp: { // > or >=
                    if (content[(offset + 1)] == QOperationSymbol::EqualExp) {
                        return QOperation::GreaterOrEqual;
                    }

                    return QOperation::Greater;
                }

                case QOperationSymbol::LessExp: { // < or <=
                    if (content[(offset + 1)] == QOperationSymbol::EqualExp) {
                        return QOperation::LessOrEqual;
                    }

                    return QOperation::Less;
                }

                case QOperationSymbol::NotExp: { // !=
                    if (content[(offset + 1)] == QOperationSymbol::EqualExp) {
                        return QOperation::NotEqual;
                    }

                    return QOperation::Error;
                }

                case QOperationSymbol::EqualExp: { // ==
                    if (content[(offset + 1)] == QOperationSymbol::EqualExp) {
                        return QOperation::Equal;
                    }

                    return QOperation::Error;
                }

                case QOperationSymbol::SubtractExp: {
                    if (isExpression(content, offset)) {
                        return QOperation::Subtraction;
                    }

                    break;
                }

                case QOperationSymbol::AddExp: {
                    if (isExpression(content, offset)) {
                        return QOperation::Addition;
                    }

                    break;
                }

                case QOperationSymbol::DivideExp: {
                    return QOperation::Division;
                }

                case QOperationSymbol::MultipleExp: {
                    return QOperation::Multiplication;
                }

                case QOperationSymbol::RemainderExp: {
                    return QOperation::Remainder;
                }

                case QOperationSymbol::ExponentExp: {
                    return QOperation::Exponent;
                }

                case QOperationSymbol::ParenthesesStart: {
                    ++offset;
                    SizeT32 skip{0U};

                    while (offset < end_offset) {
                        if (content[offset] == QOperationSymbol::ParenthesesEnd) {
                            if (skip == 0U) {
                                break;
                            }

                            --skip;
                        } else if (content[offset] == QOperationSymbol::ParenthesesStart) {
                            ++skip;
                        }

                        ++offset;
                    }

                    if (offset < end_offset) {
                        continue;
                    }

                    return QOperation::Error;
                }

                case QOperationSymbol::BracketStart: {
                    do {
                        ++offset;
                    } while ((offset < end_offset) && (content[offset] != QOperationSymbol::BracketEnd));

                    if (offset < end_offset) {
                        continue;
                    }

                    offset = end_offset;
                    return QOperation::Error;
                }

                default: {
                }
            }

            ++offset;
        }

        return QOperation::NoOp;
    }